

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cpp
# Opt level: O0

string * __thiscall
clickhouse::ColumnEnum<short>::NameAt_abi_cxx11_(ColumnEnum<short> *this,size_t n)

{
  string *psVar1;
  string *in_RDI;
  undefined6 in_stack_ffffffffffffff98;
  int16_t in_stack_ffffffffffffff9e;
  vector<short,_std::allocator<short>_> *in_stack_ffffffffffffffa0;
  string *psVar2;
  
  psVar2 = in_RDI;
  EnumType::EnumType((EnumType *)in_RDI,(TypeRef *)in_RDI);
  std::vector<short,_std::allocator<short>_>::at
            (in_stack_ffffffffffffffa0,CONCAT26(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98)
            );
  psVar1 = EnumType::GetEnumName_abi_cxx11_
                     ((EnumType *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9e);
  std::__cxx11::string::string((string *)in_RDI,(string *)psVar1);
  EnumType::~EnumType((EnumType *)0x1f9246);
  return psVar2;
}

Assistant:

const std::string ColumnEnum<T>::NameAt(size_t n) const {
    return EnumType(type_).GetEnumName(data_.at(n));
}